

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::post_timestep(NavierStokesBase *this,int crse_iteration)

{
  int iVar1;
  MultiFab *pMVar2;
  FabArray<amrex::FArrayBox> *pFVar3;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> src;
  Real RVar4;
  undefined8 uVar5;
  int iVar6;
  Periodicity *period;
  FArrayBox *this_00;
  long lVar7;
  DistributionMapping dm;
  string name;
  BoxArray ba;
  Box bx;
  char buf [64];
  ofstream ofs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_3a0 [20];
  MultiFab mf;
  
  iVar1 = *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
                   field_0x8c;
  iVar6 = (this->super_AmrLevel).level;
  if (iVar6 == iVar1) {
    pMVar2 = this->u_mac;
    iVar6 = iVar1;
    if (pMVar2 != (MultiFab *)0x0) {
      pFVar3 = pMVar2[-1].super_FabArray<amrex::FArrayBox>.os_temp._M_t.
               super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
      if (pFVar3 != (FabArray<amrex::FArrayBox> *)0x0) {
        lVar7 = (long)pFVar3 * 0x180;
        do {
          amrex::MultiFab::~MultiFab
                    ((MultiFab *)
                     ((long)&pMVar2[-1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                             _vptr_FabArrayBase + lVar7));
          lVar7 = lVar7 + -0x180;
        } while (lVar7 != 0);
      }
      operator_delete__(&pMVar2[-1].super_FabArray<amrex::FArrayBox>.os_temp,
                        (long)pFVar3 * 0x180 | 8);
      iVar6 = (this->super_AmrLevel).level;
    }
    this->u_mac = (MultiFab *)0x0;
  }
  if ((do_reflux != 0) && (iVar6 < iVar1)) {
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x35])(this);
    iVar6 = (this->super_AmrLevel).level;
  }
  if (iVar6 < iVar1) {
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x2c])(this);
    iVar6 = (this->super_AmrLevel).level;
  }
  if ((do_mac_proj != 0) && (iVar6 < iVar1)) {
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x34])(this);
    iVar6 = (this->super_AmrLevel).level;
  }
  if ((do_sync_proj != 0) && (iVar6 < iVar1)) {
    level_sync(this,crse_iteration);
    iVar6 = (this->super_AmrLevel).level;
  }
  if (0 < sum_interval && iVar6 == 0) {
    if (*(((this->super_AmrLevel).parent)->level_steps).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
        sum_interval != 0) goto LAB_0023a751;
    (*(this->super_AmrLevel)._vptr_AmrLevel[0x38])(this);
    iVar6 = (this->super_AmrLevel).level;
  }
  if (0 < iVar6) {
    incrPAvg(this);
  }
LAB_0023a751:
  amrex::BoxArray::operator=(&this->old_intersect_new,&(this->super_AmrLevel).grids);
  if (-1 < (anonymous_namespace)::dump_plane && (this->super_AmrLevel).level == 0) {
    bx.smallend.vect._0_8_ = *(undefined8 *)(this->super_AmrLevel).geom.domain.smallend.vect;
    uVar5 = *(undefined8 *)(this->super_AmrLevel).geom.domain.bigend.vect;
    bx.bigend.vect[0] = (int)uVar5;
    bx.bigend.vect[1] = (int)((ulong)uVar5 >> 0x20);
    bx.smallend.vect[2] = (anonymous_namespace)::dump_plane;
    bx.btype.itype =
         (uint)((ulong)*(undefined8 *)((this->super_AmrLevel).geom.domain.bigend.vect + 2) >> 0x20);
    bx.bigend.vect[2] = (anonymous_namespace)::dump_plane;
    amrex::BoxArray::BoxArray(&ba,&bx);
    amrex::DistributionMapping::DistributionMapping
              (&dm,&ba,*(int *)(amrex::ParallelContext::frames + 0x10));
    _ofs = 4.94065645841247e-324;
    avStack_3a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_3a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_3a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (&mf,&ba,&dm,3,0,(MFInfo *)&ofs,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_3a0);
    src.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start)->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    period = amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              (&mf.super_FabArray<amrex::FArrayBox>,
               (FabArray<amrex::FArrayBox> *)
               src.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,3,period,COPY);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) ==
        *((mf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap.m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_pmap).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
      RVar4 = amrex::StateData::curTime
                        ((this->super_AmrLevel).state.
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      sprintf(buf,"%14.12e",SUB84(RVar4,0));
      std::__cxx11::string::string
                ((string *)&name,(string *)(anonymous_namespace)::dump_plane_name_abi_cxx11_);
      std::__cxx11::string::append((char *)&name);
      std::__cxx11::string::append((char *)&name);
      std::ofstream::ofstream(&ofs);
      std::ofstream::open((char *)&ofs,(_Ios_Openmode)name._M_dataplus._M_p);
      if (*(int *)((long)&avStack_3a0[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage +
                  *(long *)((long)_ofs + -0x18)) != 0) {
        amrex::FileOpenFailed(&name);
      }
      this_00 = amrex::FabArray<amrex::FArrayBox>::fabPtr(&mf.super_FabArray<amrex::FArrayBox>,0);
      amrex::FArrayBox::writeOn(this_00,(ostream *)&ofs);
      std::ofstream::~ofstream(&ofs);
      std::__cxx11::string::~string((string *)&name);
    }
    amrex::MultiFab::~MultiFab(&mf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dm.m_ref.
                super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    amrex::BoxArray::~BoxArray(&ba);
  }
  if (0 < avg_interval) {
    iVar1 = (this->super_AmrLevel).level;
    _ofs = (((this->super_AmrLevel).parent)->dt_level).super_vector<double,_std::allocator<double>_>
           .super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar1];
    time_average(this,time_avg.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar1,
                 time_avg_fluct.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar1,
                 dt_avg.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar1,(Real *)&ofs);
  }
  return;
}

Assistant:

void
NavierStokesBase::post_timestep (int crse_iteration)
{
  BL_PROFILE("NavierStokesBase::post_timestep()");

    const int finest_level = parent->finestLevel();

#ifdef AMREX_PARTICLES
    post_timestep_particle (crse_iteration);
#endif

    if (level == parent->finestLevel())
    {
        delete [] u_mac;
        u_mac = 0;
    }

    if (do_reflux && level < finest_level)
        reflux();

    //
    // Average everything down, including P and Gradp.
    // Even though the multilevel projections average down, only
    // single level projections have been done for current timestep.
    // The linearity of the average ensures that if we average down P
    // and Gp here, then we may simply add the incremental correction
    // (which get averaged down in amrex) during the sync projection.
    //
    // avgDown also updates rho_ctime since it's needed for rho_half,
    // which is used in the sync projection.
    //
    if (level < finest_level)
        avgDown();

    if (do_mac_proj && level < finest_level)
        mac_sync();

    if (do_sync_proj && (level < finest_level))
        level_sync(crse_iteration);


    //
    // Test for conservation.
    //
    if (level==0 && sum_interval>0 && (parent->levelSteps(0)%sum_interval == 0))
    {
        sum_integrated_quantities();
    }

    if (level > 0) incrPAvg();

    old_intersect_new          = grids;

    if (level == 0 && dump_plane >= 0)
    {
        Box bx = geom.Domain();

        AMREX_ASSERT(bx.bigEnd(AMREX_SPACEDIM-1) >= dump_plane);

        bx.setSmall(AMREX_SPACEDIM-1, dump_plane);
        bx.setBig  (AMREX_SPACEDIM-1, dump_plane);

        BoxArray ba(bx);
        DistributionMapping dm{ba};

        MultiFab mf(ba, dm, AMREX_SPACEDIM, 0, MFInfo(), Factory());

        mf.ParallelCopy(get_new_data(State_Type), Xvel, 0, AMREX_SPACEDIM);

        if (ParallelDescriptor::MyProc() == mf.DistributionMap()[0])
        {
            char buf[64];
            sprintf(buf, "%14.12e", state[State_Type].curTime());

            std::string name(dump_plane_name);
            name += buf;
            name += ".fab";

            std::ofstream ofs;
            ofs.open(name.c_str(),std::ios::out|std::ios::trunc|std::ios::binary);
            if (!ofs.good())
                amrex::FileOpenFailed(name);

            mf[0].writeOn(ofs);
        }
    }

    if (avg_interval > 0)
    {
      const amrex::Real dt_level = parent->dtLevel(level);
      time_average(time_avg[level], time_avg_fluct[level], dt_avg[level], dt_level);
    }

}